

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minimize_constraint.cpp
# Opt level: O0

void __thiscall
Clasp::MinimizeBuilder::mergeLevels(MinimizeBuilder *this,SumVec *adjust,WeightVec *weights)

{
  weight_t wVar1;
  Var VVar2;
  int iVar3;
  iterator pMVar4;
  iterator pMVar5;
  reference pLVar6;
  reference plVar7;
  uint uVar8;
  iterator in_RDX;
  uchar *sig;
  uchar *sig_00;
  pod_vector<long,_std::allocator<long>_> *in_RSI;
  EVP_PKEY_CTX *ctx;
  pod_vector<Clasp::MinimizeBuilder::MLit,_std::allocator<Clasp::MinimizeBuilder::MLit>_> *in_RDI;
  uchar *in_R8;
  size_t in_R9;
  weight_t wpos;
  const_iterator k;
  const_iterator end;
  const_iterator it;
  iterator j;
  undefined4 in_stack_ffffffffffffff68;
  int in_stack_ffffffffffffff6c;
  iterator in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff78;
  uint in_stack_ffffffffffffff7c;
  Var in_stack_ffffffffffffff80;
  uint in_stack_ffffffffffffff84;
  LevelWeight local_54;
  LevelWeight local_4c;
  size_type local_44;
  iterator local_40;
  iterator local_38;
  iterator local_30;
  iterator local_28;
  iterator local_18;
  pod_vector<long,_std::allocator<long>_> *local_10;
  size_t *siglen;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  pMVar4 = bk_lib::
           pod_vector<Clasp::MinimizeBuilder::MLit,_std::allocator<Clasp::MinimizeBuilder::MLit>_>::
           begin(in_RDI);
  pMVar5 = bk_lib::
           pod_vector<Clasp::MinimizeBuilder::MLit,_std::allocator<Clasp::MinimizeBuilder::MLit>_>::
           end(in_RDI);
  std::stable_sort<Clasp::MinimizeBuilder::MLit*,Clasp::MinimizeBuilder::CmpLit>(pMVar4,pMVar5);
  local_28 = bk_lib::
             pod_vector<Clasp::MinimizeBuilder::MLit,_std::allocator<Clasp::MinimizeBuilder::MLit>_>
             ::begin(in_RDI);
  bk_lib::
  pod_vector<Clasp::SharedMinimizeData::LevelWeight,_std::allocator<Clasp::SharedMinimizeData::LevelWeight>_>
  ::clear((pod_vector<Clasp::SharedMinimizeData::LevelWeight,_std::allocator<Clasp::SharedMinimizeData::LevelWeight>_>
           *)local_18);
  bk_lib::pod_vector<Clasp::MinimizeBuilder::MLit,_std::allocator<Clasp::MinimizeBuilder::MLit>_>::
  size(in_RDI);
  bk_lib::
  pod_vector<Clasp::SharedMinimizeData::LevelWeight,_std::allocator<Clasp::SharedMinimizeData::LevelWeight>_>
  ::reserve((pod_vector<Clasp::SharedMinimizeData::LevelWeight,_std::allocator<Clasp::SharedMinimizeData::LevelWeight>_>
             *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
            in_stack_ffffffffffffff7c);
  local_30 = bk_lib::
             pod_vector<Clasp::MinimizeBuilder::MLit,_std::allocator<Clasp::MinimizeBuilder::MLit>_>
             ::begin(in_RDI);
  local_38 = bk_lib::
             pod_vector<Clasp::MinimizeBuilder::MLit,_std::allocator<Clasp::MinimizeBuilder::MLit>_>
             ::end(in_RDI);
  while (local_30 != local_38) {
    local_44 = bk_lib::
               pod_vector<Clasp::SharedMinimizeData::LevelWeight,_std::allocator<Clasp::SharedMinimizeData::LevelWeight>_>
               ::size((pod_vector<Clasp::SharedMinimizeData::LevelWeight,_std::allocator<Clasp::SharedMinimizeData::LevelWeight>_>
                       *)local_18);
    SharedMinimizeData::LevelWeight::LevelWeight(&local_4c,local_30->prio,local_30->weight);
    bk_lib::
    pod_vector<Clasp::SharedMinimizeData::LevelWeight,_std::allocator<Clasp::SharedMinimizeData::LevelWeight>_>
    ::push_back((pod_vector<Clasp::SharedMinimizeData::LevelWeight,_std::allocator<Clasp::SharedMinimizeData::LevelWeight>_>
                 *)in_stack_ffffffffffffff70,
                (LevelWeight *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
    local_40 = local_30;
    while( true ) {
      local_40 = local_40 + 1;
      in_stack_ffffffffffffff84 = in_stack_ffffffffffffff84 & 0xffffff;
      if (local_40 != local_38) {
        in_stack_ffffffffffffff80 = Literal::var(&local_40->lit);
        VVar2 = Literal::var(&local_30->lit);
        in_stack_ffffffffffffff84 =
             CONCAT13(in_stack_ffffffffffffff80 == VVar2,(int3)in_stack_ffffffffffffff84);
      }
      if ((char)(in_stack_ffffffffffffff84 >> 0x18) == '\0') break;
      pLVar6 = bk_lib::
               pod_vector<Clasp::SharedMinimizeData::LevelWeight,_std::allocator<Clasp::SharedMinimizeData::LevelWeight>_>
               ::back((pod_vector<Clasp::SharedMinimizeData::LevelWeight,_std::allocator<Clasp::SharedMinimizeData::LevelWeight>_>
                       *)local_18);
      uVar8 = *(uint *)pLVar6 & 0x7fffffff | 0x80000000;
      siglen = (size_t *)(ulong)uVar8;
      *(uint *)pLVar6 = uVar8;
      in_stack_ffffffffffffff70 = local_18;
      SharedMinimizeData::LevelWeight::LevelWeight(&local_54,local_40->prio,local_40->weight);
      ctx = (EVP_PKEY_CTX *)&local_54;
      bk_lib::
      pod_vector<Clasp::SharedMinimizeData::LevelWeight,_std::allocator<Clasp::SharedMinimizeData::LevelWeight>_>
      ::push_back((pod_vector<Clasp::SharedMinimizeData::LevelWeight,_std::allocator<Clasp::SharedMinimizeData::LevelWeight>_>
                   *)in_stack_ffffffffffffff70,
                  (LevelWeight *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
      iVar3 = Literal::sign(&local_40->lit,ctx,sig,siglen,in_R8,in_R9);
      in_stack_ffffffffffffff7c = (uint)((byte)iVar3 & 1);
      iVar3 = Literal::sign(&local_30->lit,ctx,sig_00,siglen,in_R8,in_R9);
      if (in_stack_ffffffffffffff7c != ((byte)iVar3 & 1)) {
        iVar3 = local_40->weight;
        plVar7 = bk_lib::pod_vector<long,_std::allocator<long>_>::operator[]
                           (local_10,local_40->prio);
        *plVar7 = (long)iVar3 + *plVar7;
        in_stack_ffffffffffffff6c = -local_40->weight;
        pLVar6 = bk_lib::
                 pod_vector<Clasp::SharedMinimizeData::LevelWeight,_std::allocator<Clasp::SharedMinimizeData::LevelWeight>_>
                 ::back((pod_vector<Clasp::SharedMinimizeData::LevelWeight,_std::allocator<Clasp::SharedMinimizeData::LevelWeight>_>
                         *)local_18);
        pLVar6->weight = in_stack_ffffffffffffff6c;
      }
    }
    wVar1 = local_30->prio;
    local_28->lit = (Literal)(local_30->lit).rep_;
    local_28->prio = wVar1;
    local_28->weight = local_30->weight;
    local_28->weight = local_44;
    local_28 = local_28 + 1;
    local_30 = local_40;
  }
  bk_lib::pod_vector<Clasp::MinimizeBuilder::MLit,_std::allocator<Clasp::MinimizeBuilder::MLit>_>::
  end(in_RDI);
  bk_lib::pod_vector<Clasp::MinimizeBuilder::MLit,_std::allocator<Clasp::MinimizeBuilder::MLit>_>::
  erase((pod_vector<Clasp::MinimizeBuilder::MLit,_std::allocator<Clasp::MinimizeBuilder::MLit>_> *)
        CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
        (iterator)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
        in_stack_ffffffffffffff70);
  return;
}

Assistant:

void MinimizeBuilder::mergeLevels(SumVec& adjust, SharedData::WeightVec& weights) {
	// group first by variables and then by increasing levels
	std::stable_sort(lits_.begin(), lits_.end(), CmpLit());
	LitVec::iterator j = lits_.begin();
	weights.clear(); weights.reserve(lits_.size());
	for (LitVec::const_iterator it = lits_.begin(), end = lits_.end(), k; it != end; it = k) {
		// handle first occurrence of var
		assert(it->weight > 0 && "most important occurrence of lit must have positive weight");
		weight_t wpos = (weight_t)weights.size();
		weights.push_back(SharedData::LevelWeight(it->prio, it->weight));
		// handle remaining occurrences with lower prios
		for (k = it + 1; k != end && k->lit.var() == it->lit.var(); ++k) {
			assert(k->prio > it->prio && "levels not prepared!");
			weights.back().next = 1;
			weights.push_back(SharedData::LevelWeight(k->prio, k->weight));
			if (k->lit.sign() != it->lit.sign()) {
				adjust[k->prio] += k->weight;
				weights.back().weight = -k->weight;
			}
		}
		(*j = *it).weight = wpos;
		++j;
	}
	lits_.erase(j, lits_.end());
}